

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::keyboard_event(Application *this,int key,int event,uchar mods)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  reference ppSVar4;
  long lVar5;
  reference pvVar6;
  char *pcVar7;
  Timeline *this_00;
  Application *pAVar8;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Application *in_stack_00000040;
  Mesh *m_3;
  Mesh *m_2;
  SceneObject *o_3;
  iterator __end5_1;
  iterator __begin5_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range5_1;
  SceneObject *o_2;
  iterator __end3;
  iterator __begin3;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range3;
  Vector3D v;
  double t_1;
  SceneObject *o_1;
  iterator __end7;
  iterator __begin7;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range7;
  bool remaining;
  Mesh *m_1;
  double t;
  Mesh *m;
  SceneObject *o;
  iterator __end5;
  iterator __begin5;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range5;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  Application *in_stack_fffffffffffffe10;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe18;
  Mesh *in_stack_fffffffffffffe20;
  Scene *in_stack_fffffffffffffe28;
  undefined1 isGhosted;
  Application *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Timeline *in_stack_fffffffffffffe40;
  double in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffe70;
  Spline<CMU462::Vector3D> *in_stack_fffffffffffffe78;
  double in_stack_fffffffffffffe88;
  Mesh *in_stack_fffffffffffffe90;
  long local_160;
  _Self local_110;
  _Self local_108;
  long local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  SceneObject *local_d0;
  _Self local_c8;
  _Self local_c0;
  long local_b8;
  Vector3D local_b0;
  Vector3D local_98;
  double local_80;
  SceneObject *local_78;
  _Self local_70;
  _Self local_68;
  long local_60;
  byte local_51;
  Application *in_stack_ffffffffffffffb0;
  _Self local_30;
  _Self local_28;
  long local_20;
  byte local_11;
  int local_10;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  *(undefined1 *)(in_RDI + 0x14) = 0;
  local_11 = in_CL;
  local_10 = in_EDX;
  switch(*(undefined4 *)(in_RDI + 0xc)) {
  case 0:
    if (in_ESI == 0x102) {
      if (in_EDX == 1) {
        *(byte *)(in_RDI + 0x3f9) = (*(byte *)(in_RDI + 0x3f9) ^ 0xff) & 1;
      }
    }
    else if (((in_ESI == 0x103) || (in_ESI == 0x105)) && (in_EDX == 1)) {
      DynamicScene::Scene::erase_selected_element((Scene *)in_stack_fffffffffffffe20);
    }
    break;
  case 1:
    break;
  case 2:
    if (in_ESI == 0x20) {
      if (((in_EDX == 1) && (*(int *)(in_RDI + 0x10) != 9)) && (*(int *)(in_RDI + 0x10) != 10)) {
        bVar2 = Timeline::isCurrentlyPlaying((Timeline *)(in_RDI + 0x400));
        if (bVar2) {
          Timeline::action_stop((Timeline *)(in_RDI + 0x400));
          isGhosted = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
        }
        else {
          Timeline::action_play((Timeline *)(in_RDI + 0x400));
          DynamicScene::Scene::removeObject
                    (in_stack_fffffffffffffe28,&in_stack_fffffffffffffe20->super_SceneObject);
          isGhosted = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
        }
        Timeline::isCurrentlyPlaying((Timeline *)(in_RDI + 0x400));
        setGhosted(in_stack_fffffffffffffe30,(bool)isGhosted);
      }
    }
    else if (in_ESI == 0x2d) {
      if (((in_CL & 4) == 0) || (((in_CL & 4) != 0 && (in_EDX == 1)))) {
        if ((in_CL & 1) == 0) {
          *(double *)(in_RDI + 0x230) = *(double *)(in_RDI + 0x230) - 0.01;
          if (*(double *)(in_RDI + 0x230) <= 1e-11 && *(double *)(in_RDI + 0x230) != 1e-11) {
            *(undefined8 *)(in_RDI + 0x230) = 0x3f847ae147ae147b;
          }
        }
        else {
          *(double *)(in_RDI + 0x238) = *(double *)(in_RDI + 0x238) - 0.001;
          if (*(double *)(in_RDI + 0x238) <= 0.0 && *(double *)(in_RDI + 0x238) != 0.0) {
            *(undefined8 *)(in_RDI + 0x238) = 0;
          }
        }
      }
    }
    else if (in_ESI == 0x3d) {
      if (((in_CL & 4) == 0) || (((in_CL & 4) != 0 && (in_EDX == 1)))) {
        if ((in_CL & 1) == 0) {
          *(double *)(in_RDI + 0x230) = *(double *)(in_RDI + 0x230) + 0.01;
        }
        else {
          *(double *)(in_RDI + 0x238) = *(double *)(in_RDI + 0x238) + 0.001;
          if (1.0 < *(double *)(in_RDI + 0x238)) {
            *(undefined8 *)(in_RDI + 0x238) = 0x3ff0000000000000;
          }
        }
      }
    }
    else if (in_ESI == 0x44) {
      if (in_EDX == 1) {
        *(undefined4 *)(in_RDI + 0x10) = 4;
      }
    }
    else if (in_ESI == 0x46) {
      if (in_EDX == 1) {
        *(undefined4 *)(in_RDI + 0x18) = 0;
      }
    }
    else if (in_ESI == 0x49) {
      if (in_EDX == 1) {
        *(undefined4 *)(in_RDI + 0x10) = 5;
        std::
        map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
        ::clear((map<CMU462::DynamicScene::Joint_*,_CMU462::Vector3D,_std::less<CMU462::DynamicScene::Joint_*>,_std::allocator<std::pair<CMU462::DynamicScene::Joint_*const,_CMU462::Vector3D>_>_>
                 *)0x26bb31);
      }
    }
    else if (in_ESI == 0x4b) {
      if (in_EDX == 1) {
        if (in_CL == 0) {
          lVar5 = *(long *)(*(long *)(in_RDI + 0x50) + 0x30);
          if (lVar5 == 0) {
            pAVar8 = (Application *)0x0;
          }
          else {
            pAVar8 = (Application *)
                     __dynamic_cast(lVar5,&DynamicScene::SceneObject::typeinfo,
                                    &DynamicScene::Mesh::typeinfo,0);
          }
          if (pAVar8 != (Application *)0x0) {
            Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
            DynamicScene::Mesh::keyframe(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
            Timeline::markTime(in_stack_fffffffffffffe40,iVar3);
            in_stack_fffffffffffffe10 = pAVar8;
          }
        }
        else {
          local_100 = *(long *)(in_RDI + 0x50) + 0x98;
          local_108._M_node =
               (_Base_ptr)
               std::
               set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
               ::begin((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          local_110._M_node =
               (_Base_ptr)
               std::
               set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
               ::end((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          while (bVar2 = std::operator!=(&local_108,&local_110), bVar2) {
            ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                                ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                                 in_stack_fffffffffffffe10);
            if (*ppSVar4 == (SceneObject *)0x0) {
              this_00 = (Timeline *)0x0;
            }
            else {
              this_00 = (Timeline *)
                        __dynamic_cast(*ppSVar4,&DynamicScene::SceneObject::typeinfo,
                                       &DynamicScene::Mesh::typeinfo,0);
            }
            if (this_00 != (Timeline *)0x0) {
              Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
              DynamicScene::Mesh::keyframe(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              iVar3 = (int)((ulong)(in_RDI + 0x400) >> 0x20);
              Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
              Timeline::markTime(this_00,iVar3);
            }
            std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
                      ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                       in_stack_fffffffffffffe10);
          }
        }
      }
    }
    else if (in_ESI == 0x4c) {
      if (in_EDX == 1) {
        Timeline::action_loop((Timeline *)(in_RDI + 0x400));
      }
    }
    else if (in_ESI == 0x4e) {
      if (in_EDX == 1) {
        raytrace_video(in_stack_ffffffffffffffb0);
      }
    }
    else if (in_ESI == 0x4f) {
      to_object_action(in_stack_fffffffffffffe10);
    }
    else if (in_ESI == 0x53) {
      if ((in_EDX == 1) && ((in_CL & 1) == 0)) {
        *(undefined4 *)(in_RDI + 0x18) = 1;
      }
    }
    else if (in_ESI == 0x54) {
      if (in_EDX == 1) {
        rasterize_video(in_stack_00000040);
      }
    }
    else if (in_ESI == 0x55) {
      if (in_EDX == 1) {
        *(byte *)(in_RDI + 0x46b) = (*(byte *)(in_RDI + 0x46b) ^ 0xff) & 1;
      }
    }
    else if (in_ESI == 0x57) {
      to_wave_action(in_stack_fffffffffffffe10);
    }
    else if (in_ESI == 0x5a) {
      local_b8 = *(long *)(in_RDI + 0x50) + 0x98;
      local_c0._M_node =
           (_Base_ptr)
           std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                    *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_c8._M_node =
           (_Base_ptr)
           std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::end((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                  *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      while (bVar2 = std::operator!=(&local_c0,&local_c8), bVar2) {
        ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                            ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                             in_stack_fffffffffffffe10);
        local_d0 = *ppSVar4;
        (*local_d0->_vptr_SceneObject[5])();
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_e8,0);
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)pvVar6);
        cVar1 = *pcVar7;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe20);
        if (cVar1 == 'M') {
          DynamicScene::Mesh::resetWave(in_stack_fffffffffffffe20);
        }
        std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
                  ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                   in_stack_fffffffffffffe10);
      }
    }
    else if (in_ESI == 0x102) {
      if ((in_EDX == 1) && (*(int *)(in_RDI + 0x10) == 7)) {
        DynamicScene::XFormWidget::cycleMode(*(XFormWidget **)(*(long *)(in_RDI + 0x50) + 0x90));
      }
    }
    else if ((in_ESI == 0x103) || (in_ESI == 0x105)) {
      if ((in_EDX == 1) &&
         (bVar2 = Timeline::isCurrentlyPlaying((Timeline *)(in_RDI + 0x400)), !bVar2)) {
        if (local_11 == 0) {
          if (*(int *)(in_RDI + 0x10) == 3) {
            DynamicScene::Scene::erase_selected_joint((Scene *)in_stack_fffffffffffffe20);
            *(undefined8 *)(in_RDI + 0x460) = 0;
          }
          else if (*(long *)(*(long *)(in_RDI + 0x50) + 0x30) != 0) {
            Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
            lVar5 = *(long *)(*(long *)(in_RDI + 0x50) + 0x30);
            if (lVar5 == 0) {
              lVar5 = 0;
            }
            else {
              lVar5 = __dynamic_cast(lVar5,&DynamicScene::SceneObject::typeinfo,
                                     &DynamicScene::Mesh::typeinfo,0);
            }
            if (lVar5 != 0) {
              DynamicScene::Mesh::unkeyframe
                        ((Mesh *)in_stack_fffffffffffffe10,
                         (double)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            }
            local_51 = 0;
            local_60 = *(long *)(in_RDI + 0x50) + 0x98;
            local_68._M_node =
                 (_Base_ptr)
                 std::
                 set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                 ::begin((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                          *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            local_70._M_node =
                 (_Base_ptr)
                 std::
                 set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                 ::end((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            while (bVar2 = std::operator!=(&local_68,&local_70), bVar2) {
              ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                                  ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                                   in_stack_fffffffffffffe10);
              local_78 = *ppSVar4;
              iVar3 = Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
              local_80 = (double)iVar3;
              Spline<CMU462::Vector3D>::operator()
                        (in_stack_fffffffffffffe18,(double)in_stack_fffffffffffffe10);
              bVar2 = Spline<CMU462::Vector3D>::removeKnot
                                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                 in_stack_fffffffffffffe68);
              if (bVar2) {
                local_51 = 1;
                Vector3D::Vector3D(&local_b0,&local_98);
                Spline<CMU462::Vector3D>::setValue
                          ((Spline<CMU462::Vector3D> *)in_stack_fffffffffffffe20,
                           (double)in_stack_fffffffffffffe18,(Vector3D *)in_stack_fffffffffffffe10);
                break;
              }
              std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
                        ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                         in_stack_fffffffffffffe10);
            }
            iVar3 = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
            if ((local_51 & 1) == 0) {
              Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
              Timeline::unmarkTime((Timeline *)in_stack_fffffffffffffe28,iVar3);
            }
          }
        }
        else {
          Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
          Timeline::unmarkTime
                    ((Timeline *)in_stack_fffffffffffffe28,
                     (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
          local_20 = *(long *)(in_RDI + 0x50) + 0x98;
          local_28._M_node =
               (_Base_ptr)
               std::
               set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
               ::begin((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          local_30._M_node =
               (_Base_ptr)
               std::
               set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
               ::end((set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          while (bVar2 = std::operator!=(&local_28,&local_30), bVar2) {
            ppSVar4 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                                ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                                 in_stack_fffffffffffffe10);
            if (*ppSVar4 == (SceneObject *)0x0) {
              local_160 = 0;
            }
            else {
              local_160 = __dynamic_cast(*ppSVar4,&DynamicScene::SceneObject::typeinfo,
                                         &DynamicScene::Mesh::typeinfo,0);
            }
            if (local_160 != 0) {
              Timeline::getCurrentFrame((Timeline *)(in_RDI + 0x400));
              DynamicScene::Mesh::unkeyframe
                        ((Mesh *)in_stack_fffffffffffffe10,
                         (double)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            }
            std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
                      ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                       in_stack_fffffffffffffe10);
          }
        }
      }
    }
    else if (in_ESI == 0x106) {
      if (in_CL == 1) {
        if (in_EDX == 1) {
          Timeline::action_goto_next_key_frame((Timeline *)in_stack_fffffffffffffe10);
        }
      }
      else if (in_CL == 2) {
        Timeline::action_goto_end((Timeline *)(in_RDI + 0x400));
      }
      else if (in_CL == 4) {
        if (in_EDX == 1) {
          Timeline::action_step_forward((Timeline *)(in_RDI + 0x400),1);
        }
      }
      else {
        Timeline::action_step_forward((Timeline *)(in_RDI + 0x400),1);
      }
    }
    else if (in_ESI == 0x107) {
      if (in_CL == 1) {
        if (in_EDX == 1) {
          Timeline::action_goto_prev_key_frame((Timeline *)in_stack_fffffffffffffe10);
        }
      }
      else if (in_CL == 2) {
        Timeline::action_rewind((Timeline *)(in_RDI + 0x400));
      }
      else if (in_CL == 4) {
        if (in_EDX == 1) {
          Timeline::action_step_backward((Timeline *)(in_RDI + 0x400),1);
        }
      }
      else {
        Timeline::action_step_backward((Timeline *)(in_RDI + 0x400),1);
      }
    }
    else if (in_ESI == 0x108) {
      if (in_EDX == 1) {
        Timeline::makeShorter((Timeline *)(in_RDI + 0x400),0x3c);
      }
    }
    else if (((in_ESI == 0x109) && (in_EDX == 1)) &&
            (iVar3 = Timeline::getMaxFrame((Timeline *)(in_RDI + 0x400)), iVar3 < 0x34bc0)) {
      Timeline::makeLonger((Timeline *)(in_RDI + 0x400),0x3c);
    }
    break;
  case 3:
  }
  if (((*(byte *)(in_RDI + 0x3fa) & 1) != 0) && (local_10 == 0)) {
    DynamicScene::XFormWidget::restoreLastMode(*(XFormWidget **)(*(long *)(in_RDI + 0x50) + 0x90));
  }
  *(undefined1 *)(in_RDI + 0x3fa) = 0;
  if ((local_11 != 0) && (*(int *)(in_RDI + 0xc) != 2)) {
    *(undefined1 *)(in_RDI + 0x3fa) = 1;
    if (local_11 == 1) {
      DynamicScene::XFormWidget::setScale(*(XFormWidget **)(*(long *)(in_RDI + 0x50) + 0x90));
    }
    else if (local_11 == 2) {
      DynamicScene::XFormWidget::setTranslate(*(XFormWidget **)(*(long *)(in_RDI + 0x50) + 0x90));
    }
    else if (local_11 == 4) {
      DynamicScene::XFormWidget::setRotate(*(XFormWidget **)(*(long *)(in_RDI + 0x50) + 0x90));
    }
  }
  updateWidgets(in_stack_fffffffffffffe10);
  return;
}

Assistant:

void Application::keyboard_event(int key, int event, unsigned char mods) {
  noGUI = false;
  switch (mode) {
    case ANIMATE_MODE:
      switch (key) {
        case GLFW_KEY_TAB:
          if (event == GLFW_PRESS && action == Action::Object)
            scene->elementTransform->cycleMode();
          break;
        case GLFW_KEY_L:
          if (event == GLFW_PRESS) timeline.action_loop();
          break;
        case GLFW_KEY_I:
          if (event == GLFW_PRESS) {
            action = Action::IK;
            ikTargets.clear();
          }
          break;
        case GLFW_KEY_UP:
          // One hour of video max
          if (event == GLFW_PRESS && timeline.getMaxFrame() < 216000) {
            // Give them another second
            timeline.makeLonger(60);
          }
          break;
        case GLFW_KEY_DOWN:
          if (event == GLFW_PRESS) {
            timeline.makeShorter(60);
          }
          break;
        case GLFW_KEY_SPACE:
          if (event == GLFW_PRESS && (action != Action::Raytrace_Video &&
                                      action != Action::Rasterize_Video)) {
            if (timeline.isCurrentlyPlaying())
              timeline.action_stop();
            else {
              timeline.action_play();
              scene->removeObject(scene->elementTransform);
            }
            setGhosted(!timeline.isCurrentlyPlaying() &&
                       action != Action::Wave);
          }
          break;
        case GLFW_KEY_LEFT:
          switch (mods) {
            case GLFW_MOD_SHIFT:
              if (event == GLFW_PRESS) timeline.action_goto_prev_key_frame();
              break;
            case GLFW_MOD_CONTROL:
              timeline.action_rewind();
              break;
            case GLFW_MOD_ALT:
              if (event == GLFW_PRESS) timeline.action_step_backward(1);
              break;
            default:
              timeline.action_step_backward(1);
              break;
          }
          break;
        case GLFW_KEY_RIGHT:
          switch (mods) {
            case GLFW_MOD_SHIFT:
              if (event == GLFW_PRESS) timeline.action_goto_next_key_frame();
              break;
            case GLFW_MOD_CONTROL:
              timeline.action_goto_end();
              break;
            case GLFW_MOD_ALT:
              if (event == GLFW_PRESS) timeline.action_step_forward(1);
              break;
            default:
              timeline.action_step_forward(1);
              break;
          }
          break;
        case GLFW_KEY_BACKSPACE:
        case GLFW_KEY_DELETE:
          if (event == GLFW_PRESS && !timeline.isCurrentlyPlaying()) {
            if (mods) {
              timeline.unmarkTime(timeline.getCurrentFrame());
              for (auto o : scene->objects) {
                DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
                if (m) m->unkeyframe(timeline.getCurrentFrame());
              }
            } else {
              if (action == Action::CreateJoint) {
                scene->erase_selected_joint();
                clickedJoint = nullptr;
              } else if (scene->selected.object != nullptr) {
                double t = timeline.getCurrentFrame();
                DynamicScene::Mesh *m =
                    dynamic_cast<DynamicScene::Mesh *>(scene->selected.object);
                if (m) m->unkeyframe(t);

                /* Determine if there are any other objects with knots here
                       * so we can unmark the timeline. */
                bool remaining = false;
                for (auto o : scene->objects) {
                  double t = timeline.getCurrentFrame();
                  auto v = o->positions(t);
                  if (o->positions.removeKnot(t)) {
                    remaining = true;
                    o->positions.setValue(t, v);
                    break;
                  }
                }
                if (remaining == false)
                  timeline.unmarkTime(timeline.getCurrentFrame());
              }
            }
          }
          break;
        case GLFW_KEY_O:
          to_object_action();
          break;
        case GLFW_KEY_U:
          if (event == GLFW_PRESS) useCapsuleRadius = !useCapsuleRadius;
          break;
        case GLFW_KEY_W:
          to_wave_action();
          break;
        case GLFW_KEY_Z:
          for (auto o : scene->objects) {
            if (o->getInfo()[0][0] == 'M') {  // Mesh
              ((DynamicScene::Mesh *)o)->resetWave();
            }
          }
          break;
        case GLFW_KEY_N:
          if (event == GLFW_PRESS) raytrace_video();
          break;
        case GLFW_KEY_T:
          if (event == GLFW_PRESS) rasterize_video();
          break;
        case GLFW_KEY_D:
          if (event == GLFW_PRESS) action = Action::BoneRadius;
          break;
        case GLFW_KEY_EQUAL:
          if (!(mods & GLFW_MOD_ALT) ||
              (mods & GLFW_MOD_ALT && event == GLFW_PRESS)) {
            if (mods & GLFW_MOD_SHIFT) {
              damping_factor += 0.001;
              if (damping_factor > 1) damping_factor = 1.0;
            } else {
              timestep += 0.01;
            }
          }
          break;
        case GLFW_KEY_MINUS:
          if (!(mods & GLFW_MOD_ALT) ||
              (mods & GLFW_MOD_ALT && event == GLFW_PRESS)) {
            if (mods & GLFW_MOD_SHIFT) {
              damping_factor -= 0.001;
              if (damping_factor < 0.0) damping_factor = 0.0;
            } else {
              timestep -= 0.01;
              if (timestep < EPS_D) timestep = 0.01;
            }
          }
          break;
        case GLFW_KEY_F:
          if (event == GLFW_PRESS) {
            integrator = Integrator::Forward_Euler;
          }
          break;
        case GLFW_KEY_S:
          if (event == GLFW_PRESS && !(mods & GLFW_MOD_SHIFT)) {
            integrator = Integrator::Symplectic_Euler;
          }
          break;
        case GLFW_KEY_K:
          if (event == GLFW_PRESS) {
            if (mods) {
              for (DynamicScene::SceneObject *o : scene->objects) {
                DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
                if (m) {
                  m->keyframe(timeline.getCurrentFrame());
                  timeline.markTime(timeline.getCurrentFrame());
                }
              }
            } else {
              DynamicScene::Mesh *m =
                  dynamic_cast<DynamicScene::Mesh *>(scene->selected.object);
              if (m) {
                m->keyframe(timeline.getCurrentFrame());
                timeline.markTime(timeline.getCurrentFrame());
              }
            }
          }
      }
      break;
    case RENDER_MODE:
      break;
    case VISUALIZE_MODE:
      break;
    case MODEL_MODE:
      switch (key) {
        case GLFW_KEY_BACKSPACE:
        case GLFW_KEY_DELETE:
          if (event == GLFW_PRESS) {
            scene->erase_selected_element();
          }
          break;
        case GLFW_KEY_TAB:
          if (event == GLFW_PRESS) {
            show_hud = !show_hud;
          }
          break;
        default:
          break;
      }
      break;
    default:
      break;
  }

  if (lastEventWasModKey && event == GLFW_RELEASE) {
    scene->elementTransform->restoreLastMode();
  }

  lastEventWasModKey = false;
  if (mods && mode != ANIMATE_MODE) {
    lastEventWasModKey = true;

    switch (mods) {
      case GLFW_MOD_SHIFT:
        scene->elementTransform->setScale();
        break;
      case GLFW_MOD_CONTROL:
        scene->elementTransform->setTranslate();
        break;
      case GLFW_MOD_ALT:
        scene->elementTransform->setRotate();
        break;
      default:
        break;
    }
  }

  updateWidgets();
}